

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort.scat.c
# Opt level: O2

void ga_sort_permutation(Integer *pn,Integer *index,Integer *base)

{
  long lVar1;
  undefined8 uVar2;
  long lVar3;
  Integer IVar4;
  long *plVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long *plVar9;
  Integer *pIVar10;
  long *plVar11;
  long *plVar12;
  long lVar13;
  
  uVar8 = *pn;
  if (1 < (long)uVar8) {
    uVar6 = uVar8 >> 1;
    plVar5 = base + uVar6 * 2 + ((ulong)((uint)uVar8 & 1) - 1);
    for (; uVar6 != 1; uVar6 = uVar6 - 1) {
      uVar8 = uVar6;
      plVar9 = base + (uVar6 - 1);
      while (plVar12 = plVar9 + uVar8, plVar12 <= plVar5) {
        uVar8 = uVar8 * 2;
        if (plVar12 == plVar5) {
          lVar7 = *plVar5;
          plVar11 = plVar5;
        }
        else {
          lVar13 = *plVar12;
          lVar1 = plVar12[1];
          lVar7 = lVar13;
          if (lVar13 < lVar1) {
            lVar7 = lVar1;
          }
          plVar11 = plVar12 + 1;
          if (lVar1 <= lVar13) {
            plVar11 = plVar12;
          }
          uVar8 = uVar8 | lVar13 < lVar1;
        }
        lVar13 = *plVar9;
        if (lVar7 <= lVar13) break;
        *plVar9 = lVar7;
        *plVar11 = lVar13;
        uVar2 = *(undefined8 *)((long)index + ((long)plVar9 - (long)base));
        *(undefined8 *)((long)index + ((long)plVar9 - (long)base)) =
             *(undefined8 *)((long)index + ((long)plVar11 - (long)base));
        *(undefined8 *)((long)index + ((long)plVar11 - (long)base)) = uVar2;
        plVar9 = plVar11;
      }
    }
    for (; lVar7 = (long)plVar5 - (long)base, lVar7 != 0; plVar5 = plVar5 + -1) {
      uVar8 = 1;
      pIVar10 = base;
      while (plVar9 = pIVar10 + uVar8, plVar9 <= plVar5) {
        uVar8 = uVar8 * 2;
        if (plVar9 == plVar5) {
          lVar13 = *plVar5;
          plVar12 = plVar5;
        }
        else {
          lVar1 = *plVar9;
          lVar3 = plVar9[1];
          lVar13 = lVar1;
          if (lVar1 < lVar3) {
            lVar13 = lVar3;
          }
          plVar12 = plVar9 + 1;
          if (lVar3 <= lVar1) {
            plVar12 = plVar9;
          }
          uVar8 = uVar8 | lVar1 < lVar3;
        }
        lVar1 = *pIVar10;
        if (lVar13 <= lVar1) break;
        *pIVar10 = lVar13;
        *plVar12 = lVar1;
        uVar2 = *(undefined8 *)((long)index + ((long)pIVar10 - (long)base));
        *(undefined8 *)((long)index + ((long)pIVar10 - (long)base)) =
             *(undefined8 *)((long)index + ((long)plVar12 - (long)base));
        *(undefined8 *)((long)index + ((long)plVar12 - (long)base)) = uVar2;
        pIVar10 = plVar12;
      }
      lVar13 = *base;
      *base = *plVar5;
      *plVar5 = lVar13;
      IVar4 = *index;
      *index = *(Integer *)((long)index + lVar7);
      *(Integer *)((long)index + lVar7) = IVar4;
    }
  }
  return;
}

Assistant:

void ga_sort_permutation(pn, index, base)
     Integer *pn;
     Integer *index;
     Integer *base;
{
  if (*pn < 2) return;
#  undef SWAP  
#  define SWAP(a,b) { \
    Integer ltmp; \
    Integer itmp;\
    long ia = a - base; \
    long ib = b - base; \
    ltmp=*a; *a=*b; *b=ltmp; \
    itmp=index[ia]; index[ia]=index[ib]; index[ib] = itmp;\
   }
  INDEX_SORT(base,pn,SWAP);
}